

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int net_socket_read_wait(NETSOCKET sock,int time)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long __d_1;
  long __d;
  ulong uVar7;
  long in_FS_OFFSET;
  timeval tv;
  fd_set readfds;
  timeval local_c8;
  fd_set local_b8;
  long local_38;
  
  uVar5 = sock.ipv6sock;
  uVar6 = sock._0_8_;
  uVar1 = (ulong)uVar5;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = uVar6 >> 0x20;
  local_c8.tv_sec = 0;
  local_c8.tv_usec = (__suseconds_t)(time * 1000);
  local_b8.fds_bits[0] = 0;
  local_b8.fds_bits[1] = 0;
  local_b8.fds_bits[2] = 0;
  local_b8.fds_bits[3] = 0;
  local_b8.fds_bits[4] = 0;
  local_b8.fds_bits[5] = 0;
  local_b8.fds_bits[6] = 0;
  local_b8.fds_bits[7] = 0;
  local_b8.fds_bits[8] = 0;
  local_b8.fds_bits[9] = 0;
  local_b8.fds_bits[10] = 0;
  local_b8.fds_bits[0xb] = 0;
  local_b8.fds_bits[0xc] = 0;
  local_b8.fds_bits[0xd] = 0;
  local_b8.fds_bits[0xe] = 0;
  local_b8.fds_bits[0xf] = 0;
  if ((long)uVar6 < 0) {
    uVar4 = 0;
  }
  else {
    lVar3 = __fdelt_chk(uVar7);
    local_b8.fds_bits[lVar3] = local_b8.fds_bits[lVar3] | 1L << ((byte)sock.ipv4sock & 0x3f);
    uVar4 = sock.ipv4sock;
  }
  if (-1 < (int)uVar5) {
    lVar3 = __fdelt_chk(uVar1);
    local_b8.fds_bits[lVar3] = local_b8.fds_bits[lVar3] | 1L << ((byte)sock.ipv6sock & 0x3f);
    if ((int)uVar4 <= (int)uVar5) {
      uVar4 = uVar5;
    }
  }
  select(uVar4 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
  if (-1 < (long)uVar6) {
    lVar3 = __fdelt_chk(uVar7);
    iVar2 = 1;
    if (((ulong)local_b8.fds_bits[lVar3] >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00142f37;
  }
  if (-1 < (int)uVar5) {
    lVar3 = __fdelt_chk(uVar1);
    iVar2 = 1;
    if (((ulong)local_b8.fds_bits[lVar3] >> (uVar1 & 0x3f) & 1) != 0) goto LAB_00142f37;
  }
  iVar2 = 0;
LAB_00142f37:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int net_socket_read_wait(NETSOCKET sock, int time)
{
	struct timeval tv;
	fd_set readfds;
	int sockid;

	tv.tv_sec = 0;
	tv.tv_usec = 1000*time;
	sockid = 0;

	FD_ZERO(&readfds);
	if(sock.ipv4sock >= 0)
	{
		FD_SET(sock.ipv4sock, &readfds);
		sockid = sock.ipv4sock;
	}
	if(sock.ipv6sock >= 0)
	{
		FD_SET(sock.ipv6sock, &readfds);
		if(sock.ipv6sock > sockid)
			sockid = sock.ipv6sock;
	}

	/* don't care about writefds and exceptfds */
	select(sockid+1, &readfds, NULL, NULL, &tv);

	if(sock.ipv4sock >= 0 && FD_ISSET(sock.ipv4sock, &readfds))
		return 1;

	if(sock.ipv6sock >= 0 && FD_ISSET(sock.ipv6sock, &readfds))
		return 1;

	return 0;
}